

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O0

void event_base_add_virtual_(event_base *base)

{
  int local_14;
  event_base *base_local;
  
  if (base->th_base_lock != (void *)0x0) {
    (*evthread_lock_fns_.lock)(0,base->th_base_lock);
  }
  base->virtual_event_count = base->virtual_event_count + 1;
  if (base->virtual_event_count < base->virtual_event_count_max) {
    local_14 = base->virtual_event_count_max;
  }
  else {
    local_14 = base->virtual_event_count;
  }
  base->virtual_event_count_max = local_14;
  if (base->th_base_lock != (void *)0x0) {
    (*evthread_lock_fns_.unlock)(0,base->th_base_lock);
  }
  return;
}

Assistant:

void
event_base_add_virtual_(struct event_base *base)
{
	EVBASE_ACQUIRE_LOCK(base, th_base_lock);
	base->virtual_event_count++;
	MAX_EVENT_COUNT(base->virtual_event_count_max, base->virtual_event_count);
	EVBASE_RELEASE_LOCK(base, th_base_lock);
}